

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O1

void mbedtls_chachapoly_init(mbedtls_chachapoly_context *ctx)

{
  mbedtls_chacha20_init(&ctx->chacha20_ctx);
  mbedtls_poly1305_init(&ctx->poly1305_ctx);
  ctx->aad_len = 0;
  ctx->ciphertext_len = 0;
  ctx->state = 0;
  ctx->mode = MBEDTLS_CHACHAPOLY_ENCRYPT;
  return;
}

Assistant:

void mbedtls_chachapoly_init( mbedtls_chachapoly_context *ctx )
{
    CHACHAPOLY_VALIDATE( ctx != NULL );

    mbedtls_chacha20_init( &ctx->chacha20_ctx );
    mbedtls_poly1305_init( &ctx->poly1305_ctx );
    ctx->aad_len        = 0U;
    ctx->ciphertext_len = 0U;
    ctx->state          = CHACHAPOLY_STATE_INIT;
    ctx->mode           = MBEDTLS_CHACHAPOLY_ENCRYPT;
}